

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O3

void __thiscall EmitPrettyPrint::flush(EmitPrettyPrint *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  TokenSplit *pTVar4;
  LowlevelError *this_00;
  int4 tmp;
  string local_40;
  
  iVar1 = (this->tokqueue).left;
  iVar2 = (this->tokqueue).right;
  iVar3 = (this->tokqueue).max;
  while( true ) {
    if (iVar1 == (iVar2 + 1) % iVar3) {
      this->needbreak = false;
      (*this->lowlevel->_vptr_EmitXml[0x26])();
      return;
    }
    (this->tokqueue).left = (iVar1 + 1) % iVar3;
    pTVar4 = (this->tokqueue).cache;
    if (pTVar4[iVar1].size < 0) break;
    print(this,pTVar4 + iVar1);
    iVar1 = (this->tokqueue).left;
    iVar2 = (this->tokqueue).right;
    iVar3 = (this->tokqueue).max;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot flush pretty printer. Missing group end","");
  LowlevelError::LowlevelError(this_00,&local_40);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmitPrettyPrint::flush(void)

{
  while(!tokqueue.empty()) {
    TokenSplit &tok( tokqueue.popbottom() );
    if (tok.getSize() < 0)
      throw LowlevelError("Cannot flush pretty printer. Missing group end");
    print(tok);
  }
  needbreak = false;
#ifdef PRETTY_DEBUG
  if (!scanqueue.empty())
    throw LowlevelError("prettyprint scanqueue did not flush");
  if (!indentstack.empty())
    throw LowlevelError("prettyprint indentstack did not flush");
#endif
  lowlevel->flush();
}